

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::InstanceSymbol::serializeTo(InstanceSymbol *this,ASTSerializer *serializer)

{
  string_view name;
  bool bVar1;
  ASTSerializer *in_RSI;
  size_t in_RDI;
  PortConnection *conn;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::PortConnection_*const,_18446744073709551615UL> *__range2;
  Symbol *in_stack_00000068;
  ASTSerializer *in_stack_00000070;
  string_view in_stack_00000078;
  InstanceSymbol *in_stack_ffffffffffffff68;
  ASTSerializer *__lhs;
  ASTSerializer *in_stack_ffffffffffffff78;
  ASTSerializer *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff90;
  __normal_iterator<const_slang::ast::PortConnection_*const_*,_std::span<const_slang::ast::PortConnection_*const,_18446744073709551615UL>_>
  local_60;
  span<const_slang::ast::PortConnection_*const,_18446744073709551615UL> local_58;
  span<const_slang::ast::PortConnection_*const,_18446744073709551615UL> *local_48;
  int local_30;
  void *local_28;
  ASTSerializer *local_10;
  
  local_10 = in_RSI;
  if (*(long *)(in_RDI + 0x78) == 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff80,
               (char *)in_RSI);
    ASTSerializer::write(in_RSI,local_30,local_28,*(size_t *)(in_RDI + 0x50));
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_RSI,
               (char *)in_stack_ffffffffffffff78);
    in_stack_ffffffffffffff80 = in_RSI;
    ASTSerializer::writeLink(in_stack_00000070,in_stack_00000078,in_stack_00000068);
    in_RSI = in_stack_ffffffffffffff78;
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff80,
             (char *)in_RSI);
  name._M_str = in_stack_ffffffffffffff90;
  name._M_len = in_RDI;
  ASTSerializer::startArray(in_stack_ffffffffffffff80,name);
  local_58 = getPortConnections(in_stack_ffffffffffffff68);
  local_48 = &local_58;
  local_60._M_current =
       (PortConnection **)
       std::span<const_slang::ast::PortConnection_*const,_18446744073709551615UL>::begin
                 ((span<const_slang::ast::PortConnection_*const,_18446744073709551615UL> *)
                  in_stack_ffffffffffffff68);
  std::span<const_slang::ast::PortConnection_*const,_18446744073709551615UL>::end
            ((span<const_slang::ast::PortConnection_*const,_18446744073709551615UL> *)in_RSI);
  __lhs = local_10;
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::PortConnection_*const_*,_std::span<const_slang::ast::PortConnection_*const,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::PortConnection_*const_*,_std::span<const_slang::ast::PortConnection_*const,_18446744073709551615UL>_>
                        *)__lhs,(__normal_iterator<const_slang::ast::PortConnection_*const_*,_std::span<const_slang::ast::PortConnection_*const,_18446744073709551615UL>_>
                                 *)in_stack_ffffffffffffff68);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<const_slang::ast::PortConnection_*const_*,_std::span<const_slang::ast::PortConnection_*const,_18446744073709551615UL>_>
    ::operator*(&local_60);
    ASTSerializer::startObject((ASTSerializer *)0x44fa9a);
    PortConnection::serializeTo((PortConnection *)__end2._M_current,(ASTSerializer *)conn);
    ASTSerializer::endObject((ASTSerializer *)0x44fab9);
    __gnu_cxx::
    __normal_iterator<const_slang::ast::PortConnection_*const_*,_std::span<const_slang::ast::PortConnection_*const,_18446744073709551615UL>_>
    ::operator++(&local_60);
  }
  ASTSerializer::endArray((ASTSerializer *)0x44fad2);
  return;
}

Assistant:

void InstanceSymbol::serializeTo(ASTSerializer& serializer) const {
    if (canonicalBody)
        serializer.writeLink("body", *canonicalBody);
    else
        serializer.write("body", body);

    serializer.startArray("connections");
    for (auto conn : getPortConnections()) {
        serializer.startObject();
        conn->serializeTo(serializer);
        serializer.endObject();
    }
    serializer.endArray();
}